

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetInt32
          (OptionInterpreter *this,int number,int32_t value,Type type,
          UnknownFieldSet *unknown_fields)

{
  uint64_t value_00;
  string_view str;
  Type local_1c;
  LogMessage local_18;
  
  local_1c = type;
  if (type == TYPE_SINT32) {
    value_00 = (uint64_t)(uint)(value >> 0x1f ^ value * 2);
  }
  else {
    if (type == TYPE_SFIXED32) {
      UnknownFieldSet::AddFixed32(unknown_fields,number,value);
      return;
    }
    if (type != TYPE_INT32) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x2811);
      str._M_str = "Invalid wire type for CPPTYPE_INT32: ";
      str._M_len = 0x25;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_18,str);
      absl::lts_20250127::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>(&local_18,&local_1c);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_18);
    }
    value_00 = (uint64_t)value;
  }
  UnknownFieldSet::AddVarint(unknown_fields,number,value_00);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetInt32(
    int number, int32_t value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_INT32:
      unknown_fields->AddVarint(
          number, static_cast<uint64_t>(static_cast<int64_t>(value)));
      break;

    case FieldDescriptor::TYPE_SFIXED32:
      unknown_fields->AddFixed32(number, static_cast<uint32_t>(value));
      break;

    case FieldDescriptor::TYPE_SINT32:
      unknown_fields->AddVarint(
          number, internal::WireFormatLite::ZigZagEncode32(value));
      break;

    default:
      ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_INT32: " << type;
      break;
  }
}